

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O0

void dumpSize(DumpState *D,size_t x)

{
  int local_28;
  int n;
  byte bStack_1b;
  lu_byte buff [10];
  size_t x_local;
  DumpState *D_local;
  
  local_28 = 0;
  buff._2_8_ = x;
  do {
    local_28 = local_28 + 1;
    buff[2 - (long)local_28] = (byte)buff._2_8_ & 0x7f;
    buff._2_8_ = (ulong)buff._2_8_ >> 7;
  } while (buff._2_8_ != 0);
  buff[1] = buff[1] | 0x80;
  dumpBlock(D,buff + (2 - (long)local_28),(long)local_28);
  return;
}

Assistant:

static void dumpSize (DumpState *D, size_t x) {
  lu_byte buff[DIBS];
  int n = 0;
  do {
    buff[DIBS - (++n)] = x & 0x7f;  /* fill buffer in reverse order */
    x >>= 7;
  } while (x != 0);
  buff[DIBS - 1] |= 0x80;  /* mark last byte */
  dumpVector(D, buff + DIBS - n, n);
}